

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

string * __thiscall
sentencepiece::string_util::UnicodeTextToUTF8_abi_cxx11_
          (string *__return_storage_ptr__,string_util *this,UnicodeText *utext)

{
  char32 *pcVar1;
  char32 *pcVar2;
  char buf [8];
  char acStack_28 [8];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = *(char32 **)(this + 8);
  for (pcVar2 = *(char32 **)this; pcVar2 != pcVar1; pcVar2 = pcVar2 + 1) {
    EncodeUTF8(*pcVar2,acStack_28);
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)acStack_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnicodeTextToUTF8(const UnicodeText &utext) {
  char buf[8];
  std::string result;
  for (const char32 c : utext) {
    const size_t mblen = EncodeUTF8(c, buf);
    result.append(buf, mblen);
  }
  return result;
}